

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O2

void event_end_of_breakfast(tgestate_t *state)

{
  state->bell = '(';
  if (state->hero_in_breakfast != '\0') {
    state->vischars[0].mi.mappos.u = 0x34;
    state->vischars[0].mi.mappos.v = 0x3e;
    state->hero_in_breakfast = '\0';
  }
  set_hero_route(state,(route_t *)&end_of_breakfast_t);
  state->character_structs[0x14].room = '\x19';
  state->character_structs[0x15].room = '\x19';
  state->character_structs[0x16].room = '\x19';
  state->character_structs[0x17].room = '\x17';
  state->character_structs[0x18].room = '\x17';
  state->character_structs[0x19].room = '\x17';
  set_prisoners_and_guards_route_B(state,(route_t *)&end_of_breakfast_t2);
  set_roomdef(state,'\x17',0x25,0xd);
  set_roomdef(state,'\x17',0x28,0xd);
  set_roomdef(state,'\x17',0x2b,0xd);
  set_roomdef(state,'\x19',0x1d,0xd);
  set_roomdef(state,'\x19',0x20,0xd);
  set_roomdef(state,'\x19',0x23,0xd);
  set_roomdef(state,'\x19',0x26,0xd);
  if ((byte)(state->room_index - 1) < 0x1c) {
    setup_room(state);
    plot_interior_tiles(state);
    return;
  }
  return;
}

Assistant:

static void event_end_of_breakfast(tgestate_t *state)
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  end_of_breakfast(state);
}